

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonStructMemberTypeValReq::_validate
          (JsonStructMemberTypeValReq *this,JsonVal *jsonVal)

{
  TextParseError *exc;
  JsonVal *jsonVal_local;
  JsonStructMemberTypeValReq *this_local;
  
  JsonObjValReq::_validate(&this->super_JsonObjValReq,jsonVal);
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonObjValReq::_validate(jsonVal);
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid structure member type:", jsonVal.loc());
            throw;
        }
    }